

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
     ::transfer_slot_fn(void *set,void *dst,void *src)

{
  size_t c;
  undefined8 uVar1;
  
  c = *set;
  *(undefined8 *)set = 0xffffffffffffff9c;
  uVar1 = *(undefined8 *)((long)src + 8);
  *(undefined8 *)dst = *src;
  *(undefined8 *)((long)dst + 8) = uVar1;
  *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)((long)src + 0x10);
  *(undefined8 *)((long)src + 0x10) = 0;
  CommonFields::set_capacity((CommonFields *)set,c);
  return;
}

Assistant:

size_t capacity() const { return capacity_; }